

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[17],kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::StringPtr&,char_const(&)[14],kj::String&,char_const(&)[6],char_const(&)[10],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[28],unsigned_int&,char_const(&)[30]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [17],StringTree *params_1,
          char (*params_2) [8],CppTypeName *params_3,char (*params_4) [2],StringPtr *params_5,
          char (*params_6) [14],String *params_7,char (*params_8) [6],char (*params_9) [10],
          CppTypeName *params_10,char (*params_11) [28],uint *params_12,char (*params_13) [30])

{
  char (*value) [17];
  StringTree *pSVar1;
  char (*value_00) [8];
  CppTypeName *pCVar2;
  char (*value_01) [2];
  StringPtr *value_02;
  char (*value_03) [14];
  String *value_04;
  char (*value_05) [6];
  char (*value_06) [10];
  char (*value_07) [28];
  _ *this_00;
  char (*value_08) [30];
  CppTypeName *value_09;
  CppTypeName *value_10;
  uint *value_11;
  ArrayPtr<const_char> local_130;
  CappedArray<char,_14UL> local_120;
  ArrayPtr<const_char> local_108;
  String local_f8;
  ArrayPtr<const_char> local_e0;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0 [2];
  ArrayPtr<const_char> local_80;
  String local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  CppTypeName *local_38;
  char (*params_local_4) [2];
  CppTypeName *params_local_3;
  char (*params_local_2) [8];
  StringTree *params_local_1;
  char (*params_local) [17];
  
  local_38 = params_3;
  params_local_4 = (char (*) [2])params_2;
  params_local_3 = (CppTypeName *)params_1;
  params_local_2 = (char (*) [8])params;
  params_local_1 = (StringTree *)this;
  params_local = (char (*) [17])__return_storage_ptr__;
  value = ::const((char (*) [17])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[17]>(value);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_00 = ::const((char (*) [8])params_local_3);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[8]>(value_00);
  pCVar2 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_local_4);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_70,(_ *)pCVar2,value_09);
  value_01 = ::const((char (*) [2])local_38);
  local_80 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_01);
  value_02 = fwd<kj::StringPtr&>((StringPtr *)params_4);
  local_a0[0] = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_02);
  value_03 = ::const((char (*) [14])params_5);
  local_b0 = _::toStringTreeOrCharSequence<char_const(&)[14]>(value_03);
  value_04 = fwd<kj::String&>((String *)params_6);
  local_c0 = _::toStringTreeOrCharSequence<kj::String&>(value_04);
  value_05 = ::const((char (*) [6])params_7);
  local_d0 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_05);
  value_06 = ::const((char (*) [10])params_8);
  local_e0 = _::toStringTreeOrCharSequence<char_const(&)[10]>(value_06);
  pCVar2 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_9);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_f8,(_ *)pCVar2,value_10);
  value_07 = ::const((char (*) [28])params_10);
  local_108 = _::toStringTreeOrCharSequence<char_const(&)[28]>(value_07);
  this_00 = (_ *)fwd<unsigned_int&>((uint *)params_11);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_120,this_00,value_11);
  value_08 = ::const((char (*) [30])params_12);
  local_130 = _::toStringTreeOrCharSequence<char_const(&)[30]>(value_08);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,(ArrayPtr<const_char> *)pSVar1,
             (StringTree *)&local_58,(ArrayPtr<const_char> *)&local_70,(String *)&local_80,local_a0,
             &local_b0,&local_c0,&local_d0,&local_e0,(ArrayPtr<const_char> *)&local_f8,
             (String *)&local_108,(ArrayPtr<const_char> *)&local_120,
             (CappedArray<char,_14UL> *)&local_130,(ArrayPtr<const_char> *)&stack0xfffffffffffffde8)
  ;
  String::~String(&local_f8);
  String::~String(&local_70);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}